

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O3

void ConvertRGBtoYUY2(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  Uint8 *pUVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Uint8 *rgb;
  ulong uVar5;
  int yuv [3];
  int local_3c;
  Uint8 local_38;
  Uint8 local_34;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  iVar2 = s->h;
  if (0 < iVar2) {
    iVar4 = 0;
    do {
      if (o->h <= iVar4) break;
      if (0 < s->w) {
        rgb = (Uint8 *)((ulong)((uint)s->pitch * iVar4) + (long)s->pixels);
        uVar3 = (uint)*o->pitches * iVar4;
        pUVar1 = *o->pixels;
        uVar5 = 0;
        do {
          if (o->w <= (int)uVar5) break;
          RGBtoYUV(rgb,&local_3c,monochrome,luminance);
          if ((uVar5 & 1) == 0) {
            pUVar1[uVar5 * 2 + (ulong)uVar3 + 1] = local_38;
            pUVar1[uVar5 * 2 + (ulong)uVar3 + 3] = local_34;
          }
          pUVar1[uVar5 * 2 + (ulong)uVar3] = (Uint8)local_3c;
          rgb = rgb + s->format->BytesPerPixel;
          uVar5 = uVar5 + 1;
        } while ((int)uVar5 < s->w);
        iVar2 = s->h;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar2);
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYUY2(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op;

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op=o->pixels[0]+o->pitches[0]*y;
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p,yuv, monochrome, luminance);
			if(x%2==0)
			{
				*(op++)=yuv[0];
				*(op++)=yuv[1];
				op[1]=yuv[2];
			}
			else
			{
				*op=yuv[0];
				op+=2;
			}

			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}